

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfl.c
# Opt level: O1

void cfl_luma_subsampling_420_hbd_c
               (uint16_t *input,int input_stride,uint16_t *output_q3,int width,int height)

{
  uint16_t *puVar1;
  int iVar2;
  long lVar3;
  
  if (0 < height) {
    puVar1 = input + (long)input_stride + 1;
    iVar2 = 0;
    do {
      if (0 < width) {
        lVar3 = 0;
        do {
          *(uint16_t *)((long)output_q3 + lVar3) =
               (input[lVar3 + 1] + input[lVar3] + puVar1[lVar3 + -1] + puVar1[lVar3]) * 2;
          lVar3 = lVar3 + 2;
        } while (lVar3 < width);
      }
      output_q3 = output_q3 + 0x20;
      iVar2 = iVar2 + 2;
      puVar1 = puVar1 + input_stride * 2;
      input = input + input_stride * 2;
    } while (iVar2 < height);
  }
  return;
}

Assistant:

static void cfl_luma_subsampling_420_hbd_c(const uint16_t *input,
                                           int input_stride,
                                           uint16_t *output_q3, int width,
                                           int height) {
  for (int j = 0; j < height; j += 2) {
    for (int i = 0; i < width; i += 2) {
      const int bot = i + input_stride;
      output_q3[i >> 1] =
          (input[i] + input[i + 1] + input[bot] + input[bot + 1]) << 1;
    }
    input += input_stride << 1;
    output_q3 += CFL_BUF_LINE;
  }
}